

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_table_entry_cmp(void *entry1,void *entry2)

{
  ulong *in_RSI;
  ulong *in_RDI;
  size_t minlen;
  int d;
  amqp_table_entry_t *p2;
  amqp_table_entry_t *p1;
  size_t local_38;
  int local_4;
  
  local_38 = *in_RDI;
  if (*in_RSI < local_38) {
    local_38 = *in_RSI;
  }
  local_4 = memcmp((void *)in_RDI[1],(void *)in_RSI[1],local_38);
  if (local_4 == 0) {
    local_4 = (int)*in_RDI - (int)*in_RSI;
  }
  return local_4;
}

Assistant:

int amqp_table_entry_cmp(void const *entry1, void const *entry2) {
  amqp_table_entry_t const *p1 = (amqp_table_entry_t const *)entry1;
  amqp_table_entry_t const *p2 = (amqp_table_entry_t const *)entry2;

  int d;
  size_t minlen;

  minlen = p1->key.len;
  if (p2->key.len < minlen) {
    minlen = p2->key.len;
  }

  d = memcmp(p1->key.bytes, p2->key.bytes, minlen);
  if (d != 0) {
    return d;
  }

  return (int)p1->key.len - (int)p2->key.len;
}